

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_.cpp
# Opt level: O0

int main(void)

{
  ostream *this;
  void *this_00;
  char local_41 [32];
  char local_21;
  undefined1 local_20 [8];
  vector_<char> arr;
  
  vector_<char>::vector_((vector_<char> *)local_20);
  local_21 = 'w';
  vector_<char>::push_back((vector_<char> *)local_20,&local_21);
  local_41[0xc] = 0x73;
  vector_<char>::push_back((vector_<char> *)local_20,local_41 + 0xc);
  local_41[0xb] = 0x69;
  vector_<char>::push_back((vector_<char> *)local_20,local_41 + 0xb);
  local_41[10] = 0x6d;
  vector_<char>::push_back((vector_<char> *)local_20,local_41 + 10);
  local_41[9] = 0x61;
  vector_<char>::insert((vector_<char> *)local_20,1,local_41 + 9);
  local_41[8] = 0x61;
  vector_<char>::push_back((vector_<char> *)local_20,local_41 + 8);
  local_41[7] = 0x6b;
  vector_<char>::push_back((vector_<char> *)local_20,local_41 + 7);
  local_41[6] = 0x72;
  vector_<char>::push_back((vector_<char> *)local_20,local_41 + 6);
  local_41[5] = 0x61;
  vector_<char>::push_back((vector_<char> *)local_20,local_41 + 5);
  local_41[4] = 0x6d;
  vector_<char>::push_back((vector_<char> *)local_20,local_41 + 4);
  local_41[3] = 0x6b;
  vector_<char>::push_back((vector_<char> *)local_20,local_41 + 3);
  local_41[2] = 0x68;
  vector_<char>::push_back((vector_<char> *)local_20,local_41 + 2);
  local_41[1] = 0x61;
  vector_<char>::push_back((vector_<char> *)local_20,local_41 + 1);
  local_41[0] = 'n';
  vector_<char>::push_back((vector_<char> *)local_20,local_41);
  this = operator<<((ostream *)&std::cout,(vector_<char> *)local_20);
  std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  this_00 = (void *)std::ostream::operator<<(&std::cout,0x18);
  std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  vector_<char>::clear((vector_<char> *)local_20);
  vector_<char>::~vector_((vector_<char> *)local_20);
  return 0;
}

Assistant:

int main() {
    vector_<char> arr;
    arr.push_back('w');
    arr.push_back('s');
    arr.push_back('i');
    arr.push_back('m');
    arr.insert(1, 'a');
    arr.push_back('a');
    arr.push_back('k');
    arr.push_back('r');
    arr.push_back('a');
    arr.push_back('m');
    arr.push_back('k');
    arr.push_back('h');
    arr.push_back('a');
    arr.push_back('n');
    cout << arr << endl;
    cout << sizeof(arr) << endl;
    arr.clear();
}